

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

int set_rdmult(AV1_COMP *cpi,MACROBLOCK *x,int segment_id)

{
  undefined1 uVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int qindex;
  int layer_depth;
  int boost_index;
  FRAME_TYPE frame_type;
  FRAME_UPDATE_TYPE update_type;
  aom_bit_depth_t bit_depth;
  CommonQuantParams *quant_params;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  FRAME_TYPE in_stack_ffffffffffffff93;
  int in_stack_ffffffffffffff94;
  FRAME_UPDATE_TYPE update_type_00;
  undefined4 in_stack_ffffffffffffffa0;
  aom_bit_depth_t bit_depth_00;
  int use_fixed_qp_offsets;
  aom_tune_metric local_4c;
  int iVar2;
  int local_44;
  aom_tune_metric tuning;
  
  update_type_00 = (FRAME_UPDATE_TYPE)((uint)*(undefined4 *)(in_RDI[0x8401] + 0x48) >> 0x18);
  uVar1 = *(undefined1 *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258));
  if (*(int *)(*in_RDI + 0x8b3c) / 100 < 0x10) {
    iVar2 = *(int *)(*in_RDI + 0x8b3c) / 100;
  }
  else {
    iVar2 = 0xf;
  }
  if (*(int *)(*in_RDI + 0x480 + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 6) {
    local_4c = *(aom_tune_metric *)(*in_RDI + 0x480 + (ulong)*(byte *)(in_RDI + 0xe258) * 4);
  }
  else {
    local_4c = AOM_TUNE_VMAF_MAX_GAIN;
  }
  if (in_EDX < 0) {
    local_44 = (int)in_RDI[0x783d] + *(int *)(in_RSI + 0x4210) + (int)in_RDI[0x783e];
  }
  else {
    local_44 = av1_get_qindex((segmentation *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
  }
  bit_depth_00 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffa0);
  use_fixed_qp_offsets = (int)in_RDI[0x847e];
  tuning = local_4c;
  is_stat_consumption_stage
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  iVar2 = av1_compute_rd_mult(local_4c,bit_depth_00,update_type_00,local_44,
                              in_stack_ffffffffffffff94,in_stack_ffffffffffffff93,
                              use_fixed_qp_offsets,iVar2,tuning);
  return iVar2;
}

Assistant:

static inline int set_rdmult(const AV1_COMP *const cpi,
                             const MACROBLOCK *const x, int segment_id) {
  const AV1_COMMON *const cm = &cpi->common;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const CommonQuantParams *quant_params = &cm->quant_params;
  const aom_bit_depth_t bit_depth = cm->seq_params->bit_depth;
  const FRAME_UPDATE_TYPE update_type =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index];
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);

  int qindex;
  if (segment_id >= 0) {
    qindex = av1_get_qindex(&cm->seg, segment_id, cm->quant_params.base_qindex);
  } else {
    qindex = quant_params->base_qindex + x->rdmult_delta_qindex +
             quant_params->y_dc_delta_q;
  }

  return av1_compute_rd_mult(
      qindex, bit_depth, update_type, layer_depth, boost_index, frame_type,
      cpi->oxcf.q_cfg.use_fixed_qp_offsets, is_stat_consumption_stage(cpi),
      cpi->oxcf.tune_cfg.tuning);
}